

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *fnameSessions)

{
  pointer pbVar1;
  bool bVar2;
  ImDrawListSharedData *drawListSharedData;
  uint64_t uVar3;
  uint fid;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  Session session;
  vector<ImDrawList,_std::allocator<ImDrawList>_> drawLists;
  ImDrawData drawData;
  XorRlePerDrawListWithVtxOffset compressor;
  
  printf("[+] Running benchmark for compressor \'%s\'\n","XorRlePerDrawListWithVtxOffset");
  lVar5 = 0;
  do {
    pbVar1 = (fnameSessions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(fnameSessions->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5) <=
        lVar5) {
      return true;
    }
    printf("[+] Processing session \'%s\' ...\n",pbVar1[lVar5]._M_dataplus._M_p);
    session.frames.
    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    session.frames.
    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    session.frames.
    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = Session::load(&session,pbVar1[lVar5]._M_dataplus._M_p);
    if (bVar2) {
      drawData.DisplaySize.x = 0.0;
      drawData.DisplaySize.y = 0.0;
      drawData.FramebufferScale.x = 0.0;
      drawData.FramebufferScale.y = 0.0;
      drawData.CmdLists = (ImDrawList **)0x0;
      drawData.DisplayPos.x = 0.0;
      drawData.DisplayPos.y = 0.0;
      drawData.Valid = false;
      drawData._1_3_ = 0;
      drawData.CmdListsCount = 0;
      drawData.TotalIdxCount = 0;
      drawData.TotalVtxCount = 0;
      drawLists.super__Vector_base<ImDrawList,_std::allocator<ImDrawList>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      drawLists.super__Vector_base<ImDrawList,_std::allocator<ImDrawList>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      drawLists.super__Vector_base<ImDrawList,_std::allocator<ImDrawList>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::XorRlePerDrawListWithVtxOffset
                (&compressor);
      fid = 0;
      uVar4 = 0;
      while( true ) {
        drawListSharedData = ImGui::GetDrawListSharedData();
        bVar2 = Session::getFrame(&session,fid,&drawData,&drawLists,drawListSharedData);
        if (!bVar2) break;
        bVar2 = ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::setDrawData
                          (&compressor,&drawData);
        if (!bVar2) {
          fprintf(_stderr,"    [E] Failed setting draw data for frame %d\n",(ulong)fid);
          break;
        }
        uVar3 = ImDrawDataCompressor::Interface::diffSize(&compressor.super_Interface);
        uVar4 = uVar4 + uVar3;
        fid = fid + 1;
      }
      printf("    - Compressed size   = %d bytes\n",uVar4 & 0xffffffff);
      uVar3 = Session::totalSize_bytes(&session);
      auVar6._8_4_ = (int)(uVar3 >> 0x20);
      auVar6._0_8_ = uVar3;
      auVar6._12_4_ = 0x45300000;
      auVar7._8_4_ = (int)(uVar4 >> 0x20);
      auVar7._0_8_ = uVar4;
      auVar7._12_4_ = 0x45300000;
      dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      printf("    - Compression ratio = %6.4f times\n",
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) / dVar8);
      printf("    - Average bandwidth = %6.4f kB/s (at 60.0 fps)\n",
             (60.0 / (double)(int)(((long)session.frames.
                                          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)session.frames.
                                         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x18)) *
             dVar8 * 0.0009765625);
      putchar(10);
      ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::~XorRlePerDrawListWithVtxOffset
                (&compressor);
      std::vector<ImDrawList,_std::allocator<ImDrawList>_>::~vector(&drawLists);
    }
    else {
      fwrite("    [E] Failed reading the file. Probably not an ImDrawData session file?\n",0x4a,1,
             _stderr);
    }
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector(&session.frames);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

bool benchmark(const std::vector<std::string> & fnameSessions) {
    printf("[+] Running benchmark for compressor '%s'\n", T::kName);

    for (int i = 0; i < (int) fnameSessions.size(); ++i) {
        auto & fname = fnameSessions[i];

        printf("[+] Processing session '%s' ...\n", fname.c_str());

        Session session;
        if (session.load(fname.c_str()) == false) {
            fprintf(stderr, "    [E] Failed reading the file. Probably not an ImDrawData session file?\n");
            continue;
        }

        int fid = 0;
        ImDrawData drawData;
        std::vector<ImDrawList> drawLists;

        T compressor;
        uint64_t compressedSize_bytes = 0;
        while (session.getFrame(fid, &drawData, drawLists, ImGui::GetDrawListSharedData())) {
            if (compressor.setDrawData(&drawData) == false) {
                fprintf(stderr, "    [E] Failed setting draw data for frame %d\n", fid);
                break;
            }

            compressedSize_bytes += compressor.diffSize();

            ++fid;
        }

        printf("    - Compressed size   = %d bytes\n", (int) compressedSize_bytes);
        printf("    - Compression ratio = %6.4f times\n", ((double)(session.totalSize_bytes()))/compressedSize_bytes);
        printf("    - Average bandwidth = %6.4f kB/s (at 60.0 fps)\n", ((double)(compressedSize_bytes))/1024.0*(60.0/session.nFrames()));
        printf("\n");
    }

    return true;
}